

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_13::PoppifyFunctionsPass::runOnFunction
          (PoppifyFunctionsPass *this,Module *module,Function *func)

{
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  bool bVar2;
  size_t sVar3;
  mapped_type *this_00;
  Type *pTVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  undefined1 local_100 [48];
  __node_base_ptr *local_d0;
  size_type local_c8;
  __node_base local_c0;
  size_type sStack_b8;
  float local_b0;
  size_t local_a8;
  __node_base_ptr p_Stack_a0;
  __node_base_ptr *local_98;
  size_type local_90;
  __node_base local_88;
  size_type sStack_80;
  float local_78;
  size_t local_70;
  __node_base_ptr p_Stack_68;
  size_t local_60;
  Type local_58;
  Type localType;
  undefined1 local_48 [8];
  Iterator __begin4;
  Index i;
  
  if (func->profile != Poppy) {
    local_100._40_8_ = (pointer)0x0;
    local_100._24_8_ = (pointer)0x0;
    local_100._32_8_ = (pointer)0x0;
    local_d0 = &p_Stack_a0;
    local_c8 = 1;
    local_c0._M_nxt = (_Hash_node_base *)0x0;
    sStack_b8 = 0;
    local_b0 = 1.0;
    local_a8 = 0;
    p_Stack_a0 = (__node_base_ptr)0x0;
    local_98 = &p_Stack_68;
    local_90 = 1;
    local_88._M_nxt = (_Hash_node_base *)0x0;
    sStack_80 = 0;
    local_78 = 1.0;
    local_70 = 0;
    p_Stack_68 = (__node_base_ptr)0x0;
    local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
    local_100._0_8_ = func;
    local_100._8_8_ = module;
    local_100._16_8_ = module;
    std::
    vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
    ::emplace_back<wasm::(anonymous_namespace)::Poppifier::Scope::Kind>
              ((vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
                *)(local_100 + 0x18),(Kind *)local_48);
    sVar3 = Function::getNumParams(func);
    __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._4_4_ =
         (uint)sVar3;
    local_60 = Function::getNumLocals(func);
    while( true ) {
      if ((uint)local_60 <= (uint)sVar3) break;
      local_58 = Function::getLocalType(func,(uint)sVar3);
      bVar2 = wasm::Type::isTuple(&local_58);
      if (bVar2) {
        this_00 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_d0,
                               (key_type *)
                               ((long)&__begin4.
                                       super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .index + 4));
        local_48 = (undefined1  [8])&local_58;
        __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        PVar5 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                wasm::Type::end((Type *)local_48);
        for (; PVar1.index = (size_t)__begin4.
                                     super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                     .parent, PVar1.parent = (Type *)local_48, PVar5 != PVar1;
            __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin4.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1)) {
          pTVar4 = wasm::Type::Iterator::operator*((Iterator *)local_48);
          localType.id._4_4_ = Builder::addVar(func,(Type)pTVar4->id);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (this_00,(uint *)((long)&localType.id + 4));
        }
      }
      __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._4_4_ =
           __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._4_4_
           + 1;
      sVar3 = (size_t)__begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index._4_4_;
    }
    if ((Function *)local_100._0_8_ == (Function *)0x0) {
      __assert_fail("func && \"BinaryenIRWriter: function is not set\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-stack.h"
                    ,0xc5,
                    "void wasm::BinaryenIRWriter<wasm::(anonymous namespace)::Poppifier>::write() [SubType = wasm::(anonymous namespace)::Poppifier]"
                   );
    }
    BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::visitPossibleBlockContents
              ((BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *)local_100,
               *(Expression **)(local_100._0_8_ + 0x60));
    if (((pointer)(local_100._32_8_ + -0x20))->kind != Func) {
      __assert_fail("scope.kind == Scope::Func",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Poppify.cpp"
                    ,0x136,"void wasm::(anonymous namespace)::Poppifier::emitFunctionEnd()");
    }
    Poppifier::patchScope((Poppifier *)local_100,(Expression **)(local_100._0_8_ + 0x60));
    Poppifier::~Poppifier((Poppifier *)local_100);
    func->profile = Poppy;
  }
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    if (func->profile != IRProfile::Poppy) {
      Poppifier(func, module).write();
      func->profile = IRProfile::Poppy;
    }
  }